

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType * find_variable(Context_conflict *ctx,char *sym,int *_index)

{
  MOJOSHADER_astDataType *pMVar1;
  void *_item;
  void *local_18;
  
  local_18 = (void *)0x0;
  hash_find((ctx->variables).hash,sym,&local_18);
  if (local_18 == (void *)0x0) {
    pMVar1 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    *(int *)((long)local_18 + 0x14) = *(int *)((long)local_18 + 0x14) + 1;
    if (_index != (int *)0x0) {
      *_index = *(int *)((long)local_18 + 0x10);
    }
    pMVar1 = *(MOJOSHADER_astDataType **)((long)local_18 + 8);
  }
  return pMVar1;
}

Assistant:

static inline const MOJOSHADER_astDataType *find_variable(Context *ctx, const char *sym, int *_index)
{
    return find_symbol(ctx, &ctx->variables, sym, _index);
}